

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MemoryLeakDetectorTest_sequenceNumbersOfMemoryLeaks_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_sequenceNumbersOfMemoryLeaks_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_sequenceNumbersOfMemoryLeaks_Test *this_00;
  
  this_00 = (TEST_MemoryLeakDetectorTest_sequenceNumbersOfMemoryLeaks_Test *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0x93);
  TEST_MemoryLeakDetectorTest_sequenceNumbersOfMemoryLeaks_Test::
  TEST_MemoryLeakDetectorTest_sequenceNumbersOfMemoryLeaks_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, sequenceNumbersOfMemoryLeaks)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 1);
    char* mem2 = detector->allocMemory(defaultNewAllocator(), 2);
    char* mem3 = detector->allocMemory(defaultNewAllocator(), 3);
    SimpleString output = detector->report(mem_leak_period_checking);

    STRCMP_CONTAINS("Alloc num (1)", output.asCharString());
    STRCMP_CONTAINS("Alloc num (2)", output.asCharString());
    STRCMP_CONTAINS("Alloc num (3)", output.asCharString());

    PlatformSpecificFree(mem);
    PlatformSpecificFree(mem2);
    PlatformSpecificFree(mem3);
}